

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

const_iterator * __thiscall llvm::sys::path::const_iterator::operator++(const_iterator *this)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  Style SVar5;
  size_t sVar6;
  size_t sVar7;
  char *Str;
  StringRef SVar8;
  bool local_d9;
  byte local_c9;
  char *local_a8;
  size_t local_a0;
  StringRef local_98;
  size_type local_88;
  size_t end_pos;
  size_t local_78;
  StringRef local_70;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  StringRef local_40;
  byte local_29;
  undefined1 auStack_28 [7];
  bool was_net;
  size_t local_20;
  const_iterator *local_18;
  const_iterator *this_local;
  
  uVar1 = this->Position;
  local_18 = this;
  sVar6 = StringRef::size(&this->Path);
  if (sVar6 <= uVar1) {
    __assert_fail("Position < Path.size() && \"Tried to increment past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Path.cpp"
                  ,0xc4,"const_iterator &llvm::sys::path::const_iterator::operator++()");
  }
  sVar6 = StringRef::size(&this->Component);
  this->Position = sVar6 + this->Position;
  sVar6 = this->Position;
  sVar7 = StringRef::size(&this->Path);
  if (sVar6 == sVar7) {
    memset(auStack_28,0,0x10);
    StringRef::StringRef((StringRef *)auStack_28);
    (this->Component).Data = _auStack_28;
    (this->Component).Length = local_20;
    return this;
  }
  sVar6 = StringRef::size(&this->Component);
  local_c9 = 0;
  if (2 < sVar6) {
    cVar2 = StringRef::operator[](&this->Component,0);
    bVar3 = is_separator(cVar2,this->S);
    local_c9 = 0;
    if (bVar3) {
      cVar2 = StringRef::operator[](&this->Component,1);
      cVar4 = StringRef::operator[](&this->Component,0);
      local_c9 = 0;
      if (cVar2 == cVar4) {
        cVar2 = StringRef::operator[](&this->Component,2);
        bVar3 = is_separator(cVar2,this->S);
        local_c9 = bVar3 ^ 0xff;
      }
    }
  }
  local_29 = local_c9 & 1;
  cVar2 = StringRef::operator[](&this->Path,this->Position);
  bVar3 = is_separator(cVar2,this->S);
  if (bVar3) {
    if ((local_29 & 1) != 0) {
LAB_02888f2d:
      SVar8 = StringRef::substr(&this->Path,this->Position,1);
      local_50 = SVar8.Data;
      (this->Component).Data = local_50;
      local_48 = SVar8.Length;
      (this->Component).Length = local_48;
      return this;
    }
    SVar5 = anon_unknown.dwarf_3697931::real_style(this->S);
    if (SVar5 == windows) {
      StringRef::StringRef(&local_40,":");
      bVar3 = StringRef::endswith(&this->Component,local_40);
      if (bVar3) goto LAB_02888f2d;
    }
    while( true ) {
      sVar6 = this->Position;
      sVar7 = StringRef::size(&this->Path);
      local_d9 = false;
      if (sVar6 != sVar7) {
        cVar2 = StringRef::operator[](&this->Path,this->Position);
        local_d9 = is_separator(cVar2,this->S);
      }
      if (local_d9 == false) break;
      this->Position = this->Position + 1;
    }
    sVar6 = this->Position;
    sVar7 = StringRef::size(&this->Path);
    if (sVar6 == sVar7) {
      local_60 = (this->Component).Data;
      local_58 = (this->Component).Length;
      StringRef::StringRef(&local_70,"/");
      SVar8.Length = local_58;
      SVar8.Data = local_60;
      bVar3 = llvm::operator!=(SVar8,local_70);
      if (bVar3) {
        this->Position = this->Position - 1;
        StringRef::StringRef((StringRef *)&end_pos,".");
        (this->Component).Data = (char *)end_pos;
        (this->Component).Length = local_78;
        return this;
      }
    }
  }
  Str = anon_unknown.dwarf_3697931::separators(this->S);
  StringRef::StringRef(&local_98,Str);
  local_88 = StringRef::find_first_of(&this->Path,local_98,this->Position);
  SVar8 = StringRef::slice(&this->Path,this->Position,local_88);
  local_a8 = SVar8.Data;
  (this->Component).Data = local_a8;
  local_a0 = SVar8.Length;
  (this->Component).Length = local_a0;
  return this;
}

Assistant:

const_iterator &const_iterator::operator++() {
  assert(Position < Path.size() && "Tried to increment past end!");

  // Increment Position to past the current component
  Position += Component.size();

  // Check for end.
  if (Position == Path.size()) {
    Component = StringRef();
    return *this;
  }

  // Both POSIX and Windows treat paths that begin with exactly two separators
  // specially.
  bool was_net = Component.size() > 2 && is_separator(Component[0], S) &&
                 Component[1] == Component[0] && !is_separator(Component[2], S);

  // Handle separators.
  if (is_separator(Path[Position], S)) {
    // Root dir.
    if (was_net ||
        // c:/
        (real_style(S) == Style::windows && Component.endswith(":"))) {
      Component = Path.substr(Position, 1);
      return *this;
    }

    // Skip extra separators.
    while (Position != Path.size() && is_separator(Path[Position], S)) {
      ++Position;
    }

    // Treat trailing '/' as a '.', unless it is the root dir.
    if (Position == Path.size() && Component != "/") {
      --Position;
      Component = ".";
      return *this;
    }
  }

  // Find next component.
  size_t end_pos = Path.find_first_of(separators(S), Position);
  Component = Path.slice(Position, end_pos);

  return *this;
}